

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_query_node.cpp
# Opt level: O2

void __thiscall duckdb::RecursiveCTENode::Serialize(RecursiveCTENode *this,Serializer *serializer)

{
  ulong in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  QueryNode::Serialize(&this->super_QueryNode,serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,200,"cte_name",&this->ctename);
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xc9,"union_all",&this->union_all,(bool *)((long)&uStack_18 + 7));
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
            (serializer,0xca,"left",&this->left);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
            (serializer,0xcb,"right",&this->right);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0xcc,"aliases",&this->aliases);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (serializer,0xcd,"key_targets",&this->key_targets);
  return;
}

Assistant:

void RecursiveCTENode::Serialize(Serializer &serializer) const {
	QueryNode::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "cte_name", ctename);
	serializer.WritePropertyWithDefault<bool>(201, "union_all", union_all, false);
	serializer.WritePropertyWithDefault<unique_ptr<QueryNode>>(202, "left", left);
	serializer.WritePropertyWithDefault<unique_ptr<QueryNode>>(203, "right", right);
	serializer.WritePropertyWithDefault<vector<string>>(204, "aliases", aliases);
	serializer.WritePropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(205, "key_targets", key_targets);
}